

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_133e1dc::HandleCopyFile
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  CopyResult CVar5;
  int iVar6;
  string *psVar7;
  offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> member;
  _Alloc_hider _Var8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  undefined1 local_158 [32];
  string newname;
  string oldname;
  string err;
  _Any_data local_b8;
  _Manager_type local_a8;
  pointer ppStack_a0;
  pointer local_98;
  pointer ppStack_90;
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&err,"COPY_FILE must be called with at least two additional arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)err._M_dataplus._M_p != &err.field_2) {
      operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  pcVar3 = pbVar2[1]._M_dataplus._M_p;
  oldname._M_dataplus._M_p = (pointer)&oldname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&oldname,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
  bVar4 = cmsys::SystemTools::FileIsFullPath(&oldname);
  if (!bVar4) {
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    err._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
    err._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
    err.field_2._M_allocated_capacity = 0;
    arguments.Result._M_string_length = (size_type)&arguments.Result.field_2;
    arguments.InputMayBeRecent = false;
    arguments.OnlyIfDifferent = false;
    arguments._2_6_ = 0;
    arguments.Result._M_dataplus._M_p = &DAT_00000001;
    arguments.Result.field_2._M_local_buf[0] = '/';
    err.field_2._8_8_ = 1;
    local_b8._0_8_ = 0;
    views._M_len = 3;
    views._M_array = (iterator)&err;
    cmCatViews(&newname,views);
    std::__cxx11::string::operator=((string *)&oldname,(string *)&newname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)newname._M_dataplus._M_p != &newname.field_2) {
      operator_delete(newname._M_dataplus._M_p,newname.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  newname._M_dataplus._M_p = (pointer)&newname.field_2;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&newname,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  bVar4 = cmsys::SystemTools::FileIsFullPath(&newname);
  if (!bVar4) {
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    err._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
    err._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
    err.field_2._M_allocated_capacity = 0;
    arguments.Result._M_string_length = (size_type)&arguments.Result.field_2;
    arguments.InputMayBeRecent = false;
    arguments.OnlyIfDifferent = false;
    arguments._2_6_ = 0;
    arguments.Result._M_dataplus._M_p = &DAT_00000001;
    arguments.Result.field_2._M_local_buf[0] = '/';
    err.field_2._8_8_ = 1;
    local_b8._0_8_ = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&err;
    cmCatViews((string *)local_158,views_00);
    std::__cxx11::string::operator=((string *)&newname,(string *)local_158);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
  }
  if (((anonymous_namespace)::
       HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar6 != 0)) {
    local_98 = (pointer)0x0;
    ppStack_90 = (pointer)0x0;
    local_a8 = (_Manager_type)0x0;
    ppStack_a0 = (pointer)0x0;
    local_b8._0_8_ = 0;
    local_b8._8_8_ = 0;
    err.field_2._M_allocated_capacity = 0;
    err.field_2._8_8_ = 0;
    err._M_dataplus._M_p = (pointer)0x0;
    err._M_string_length = 0;
    name.super_string_view._M_str = "INPUT_MAY_BE_RECENT";
    name.super_string_view._M_len = 0x13;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&err,name,0);
    member = 1;
    name_00.super_string_view._M_str = "ONLY_IF_DIFFERENT";
    name_00.super_string_view._M_len = 0x11;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&err,name_00,1);
    name_01.super_string_view._M_str = "RESULT";
    name_01.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&err,name_01,member);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)&HandleCopyFile::parser,(ActionMap *)&err);
    ArgumentParser::Base::~Base((Base *)&err);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCopyFile::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  err.field_2._M_allocated_capacity = (size_type)&unconsumedArgs;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_158._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  paVar1 = &arguments.Result.field_2;
  arguments._0_8_ = arguments._0_8_ & 0xffffffffffff0000;
  arguments.Result._M_string_length = 0;
  arguments.Result.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&HandleCopyFile::parser;
  err._M_string_length = 0;
  err.field_2._8_8_ = &arguments;
  local_b8._0_8_ = 0;
  local_b8._8_8_ = 0;
  local_a8 = (_Manager_type)0x0;
  ppStack_a0 = (pointer)0x0;
  local_98 = (pointer)((ulong)local_98 & 0xffffffffffffff00);
  arguments.Result._M_dataplus._M_p = (pointer)paVar1;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&err,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_158,0);
  if (local_a8 != (_Manager_type)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&err,"COPY_FILE unknown argument:\n  ",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)err._M_dataplus._M_p != &err.field_2) {
      operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
    goto LAB_003bfa8d;
  }
  bVar4 = cmsys::SystemTools::FileIsDirectory(&oldname);
  psVar7 = &arguments.Result;
  if (bVar4) {
    bVar4 = arguments.Result._M_string_length != 0;
    if (bVar4) {
      value._M_str = "cannot copy a directory";
      value._M_len = 0x17;
      cmMakefile::AddDefinition(status->Makefile,psVar7,value);
      goto LAB_003bfa8d;
    }
    err._M_dataplus._M_p = (pointer)0x24;
    err._M_string_length = (size_type)anon_var_dwarf_1389412;
    err.field_2._M_allocated_capacity = 0;
    err.field_2._8_8_ = oldname._M_string_length;
    views_01._M_len = 2;
    views_01._M_array = (iterator)&err;
    cmCatViews((string *)local_158,views_01);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003bfc8c:
    _Var8._M_p = (pointer)local_158._0_8_;
    if ((pointer)local_158._0_8_ == (pointer)(local_158 + 0x10)) goto LAB_003bfa8d;
  }
  else {
    bVar4 = cmsys::SystemTools::FileIsDirectory(&newname);
    if (bVar4) {
      bVar4 = arguments.Result._M_string_length != 0;
      if (bVar4) {
        value_00._M_str = "cannot copy to a directory";
        value_00._M_len = 0x1a;
        cmMakefile::AddDefinition(status->Makefile,psVar7,value_00);
        goto LAB_003bfa8d;
      }
      err._M_dataplus._M_p = (pointer)0x27;
      err._M_string_length = (size_type)anon_var_dwarf_138942c;
      err.field_2._M_allocated_capacity = 0;
      err.field_2._8_8_ = newname._M_string_length;
      views_02._M_len = 2;
      views_02._M_array = (iterator)&err;
      cmCatViews((string *)local_158,views_02);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_003bfc8c;
    }
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
    CVar5 = cmSystemTools::CopySingleFile
                      (&oldname,&newname,(uint)arguments.OnlyIfDifferent,
                       (uint)arguments.InputMayBeRecent,&err);
    if (CVar5 == Success) {
      bVar4 = true;
      if (arguments.Result._M_string_length != 0) {
        value_02._M_str = "0";
        value_02._M_len = 1;
        cmMakefile::AddDefinition(status->Makefile,psVar7,value_02);
      }
    }
    else if (arguments.Result._M_string_length == 0) {
      cmStrCat<char_const(&)[28],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                ((string *)local_158,(char (*) [28])"COPY_FILE failed to copy\n  ",&oldname,
                 (char (*) [7])"\nto\n  ",&newname,(char (*) [11])"\nbecause: ",&err,
                 (char (*) [2])0x8e2776);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      bVar4 = false;
    }
    else {
      bVar4 = true;
      value_01._M_str = err._M_dataplus._M_p;
      value_01._M_len = err._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,psVar7,value_01);
    }
    local_158._16_8_ = err.field_2._M_allocated_capacity;
    _Var8._M_p = err._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)err._M_dataplus._M_p == &err.field_2) goto LAB_003bfa8d;
  }
  operator_delete(_Var8._M_p,local_158._16_8_ + 1);
LAB_003bfa8d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arguments.Result._M_dataplus._M_p != paVar1) {
    operator_delete(arguments.Result._M_dataplus._M_p,
                    CONCAT71(arguments.Result.field_2._M_allocated_capacity._1_7_,
                             arguments.Result.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newname._M_dataplus._M_p != &newname.field_2) {
    operator_delete(newname._M_dataplus._M_p,newname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)oldname._M_dataplus._M_p != &oldname.field_2) {
    operator_delete(oldname._M_dataplus._M_p,oldname.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool HandleCopyFile(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("COPY_FILE must be called with at least two additional "
                    "arguments");
    return false;
  }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(oldname)) {
    oldname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }
  std::string newname = args[2];
  if (!cmsys::SystemTools::FileIsFullPath(newname)) {
    newname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[2]);
  }

  struct Arguments
  {
    bool InputMayBeRecent = false;
    bool OnlyIfDifferent = false;
    std::string Result;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("INPUT_MAY_BE_RECENT"_s, &Arguments::InputMayBeRecent)
      .Bind("ONLY_IF_DIFFERENT"_s, &Arguments::OnlyIfDifferent)
      .Bind("RESULT"_s, &Arguments::Result);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);
  if (!unconsumedArgs.empty()) {
    status.SetError("COPY_FILE unknown argument:\n  " +
                    unconsumedArgs.front());
    return false;
  }

  bool result = true;
  if (cmsys::SystemTools::FileIsDirectory(oldname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy a directory\n  ", oldname));
      result = false;
    }
    return result;
  }
  if (cmsys::SystemTools::FileIsDirectory(newname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy to a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy to a directory\n  ", newname));
      result = false;
    }
    return result;
  }

  cmSystemTools::CopyWhen when;
  if (arguments.OnlyIfDifferent) {
    when = cmSystemTools::CopyWhen::OnlyIfDifferent;
  } else {
    when = cmSystemTools::CopyWhen::Always;
  }
  cmSystemTools::CopyInputRecent const inputRecent = arguments.InputMayBeRecent
    ? cmSystemTools::CopyInputRecent::Yes
    : cmSystemTools::CopyInputRecent::No;

  std::string err;
  if (cmSystemTools::CopySingleFile(oldname, newname, when, inputRecent,
                                    &err) ==
      cmSystemTools::CopyResult::Success) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, "0");
    }
  } else {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
    } else {
      status.SetError(cmStrCat("COPY_FILE failed to copy\n  ", oldname,
                               "\nto\n  ", newname, "\nbecause: ", err, "\n"));
      result = false;
    }
  }

  return result;
}